

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

LY_ERR lyxml_ctx_new(ly_ctx *ctx,ly_in *in,lyxml_ctx **xmlctx_p)

{
  ly_bool local_39;
  lyxml_ctx *plStack_38;
  ly_bool closing;
  lyxml_ctx *xmlctx;
  lyxml_ctx **pplStack_28;
  LY_ERR ret;
  lyxml_ctx **xmlctx_p_local;
  ly_in *in_local;
  ly_ctx *ctx_local;
  
  xmlctx._4_4_ = 0;
  pplStack_28 = xmlctx_p;
  xmlctx_p_local = (lyxml_ctx **)in;
  in_local = (ly_in *)ctx;
  plStack_38 = (lyxml_ctx *)calloc(1,0x68);
  if (plStack_38 == (lyxml_ctx *)0x0) {
    ly_log((ly_ctx *)in_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyxml_ctx_new");
    ctx_local._4_4_ = LY_EMEM;
  }
  else {
    plStack_38->ctx = (ly_ctx *)in_local;
    plStack_38->in = (ly_in *)xmlctx_p_local;
    ly_log_location((lysc_node *)0x0,(lyd_node *)0x0,(char *)0x0,(ly_in *)xmlctx_p_local);
    xmlctx._4_4_ = lyxml_next_element(plStack_38,&(plStack_38->field_3).prefix,
                                      &(plStack_38->field_4).prefix_len,&(plStack_38->field_5).name,
                                      &(plStack_38->field_6).name_len,&local_39);
    if (xmlctx._4_4_ == LY_SUCCESS) {
      if (*plStack_38->in->current == '\0') {
        plStack_38->status = LYXML_END;
      }
      else if (local_39 == '\0') {
        xmlctx._4_4_ = lyxml_open_element(plStack_38,(plStack_38->field_3).prefix,
                                          (plStack_38->field_4).prefix_len,
                                          (plStack_38->field_5).name,(plStack_38->field_6).name_len)
        ;
        if (xmlctx._4_4_ == LY_SUCCESS) {
          plStack_38->status = LYXML_ELEMENT;
        }
      }
      else {
        ly_vlog((ly_ctx *)in_local,(char *)0x0,LYVE_SYNTAX,"Stray closing element tag (\"%.*s\").",
                (plStack_38->field_6).name_len & 0xffffffff,(plStack_38->field_5).name);
        xmlctx._4_4_ = LY_EVALID;
      }
    }
    if (xmlctx._4_4_ == LY_SUCCESS) {
      *pplStack_28 = plStack_38;
    }
    else {
      lyxml_ctx_free(plStack_38);
    }
    ctx_local._4_4_ = xmlctx._4_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

LY_ERR
lyxml_ctx_new(const struct ly_ctx *ctx, struct ly_in *in, struct lyxml_ctx **xmlctx_p)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxml_ctx *xmlctx;
    ly_bool closing;

    /* new context */
    xmlctx = calloc(1, sizeof *xmlctx);
    LY_CHECK_ERR_RET(!xmlctx, LOGMEM(ctx), LY_EMEM);
    xmlctx->ctx = ctx;
    xmlctx->in = in;

    ly_log_location(NULL, NULL, NULL, in);

    /* parse next element, if any */
    LY_CHECK_GOTO(ret = lyxml_next_element(xmlctx, &xmlctx->prefix, &xmlctx->prefix_len, &xmlctx->name,
            &xmlctx->name_len, &closing), cleanup);

    if (xmlctx->in->current[0] == '\0') {
        /* update status */
        xmlctx->status = LYXML_END;
    } else if (closing) {
        LOGVAL(ctx, LYVE_SYNTAX, "Stray closing element tag (\"%.*s\").", (int)xmlctx->name_len, xmlctx->name);
        ret = LY_EVALID;
        goto cleanup;
    } else {
        /* open an element, also parses all enclosed namespaces */
        LY_CHECK_GOTO(ret = lyxml_open_element(xmlctx, xmlctx->prefix, xmlctx->prefix_len, xmlctx->name, xmlctx->name_len), cleanup);

        /* update status */
        xmlctx->status = LYXML_ELEMENT;
    }

cleanup:
    if (ret) {
        lyxml_ctx_free(xmlctx);
    } else {
        *xmlctx_p = xmlctx;
    }
    return ret;
}